

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void ** __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
CreateEmptyTable(InnerMap *this,size_type n)

{
  void **__s;
  long in_RSI;
  void **result;
  size_type in_stack_ffffffffffffff28;
  InnerMap *in_stack_ffffffffffffff30;
  
  __s = Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::Alloc<void*>
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  memset(__s,0,in_RSI << 3);
  return __s;
}

Assistant:

void** CreateEmptyTable(size_type n) {
      GOOGLE_DCHECK(n >= kMinTableSize);
      GOOGLE_DCHECK_EQ(n & (n - 1), 0);
      void** result = Alloc<void*>(n);
      memset(result, 0, n * sizeof(result[0]));
      return result;
    }